

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_ManCheckFanouts(Cbs2_Man_t *p)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_1c;
  int iObj;
  Gia_Obj_t *pObj;
  Cbs2_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    bVar3 = false;
    if (local_1c < p->pAig->nObjs) {
      pGVar2 = Gia_ManObj(p->pAig,local_1c);
      bVar3 = pGVar2 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) {
      return;
    }
    iVar1 = Vec_IntEntry(&p->vFanout0,local_1c);
    if (iVar1 != 0) {
      __assert_fail("Vec_IntEntry(&p->vFanout0, iObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x606,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
    }
    iVar1 = Abc_Var2Lit(local_1c,0);
    iVar1 = Vec_IntEntry(&p->vFanoutN,iVar1);
    if (iVar1 != 0) break;
    iVar1 = Abc_Var2Lit(local_1c,1);
    iVar1 = Vec_IntEntry(&p->vFanoutN,iVar1);
    if (iVar1 != 0) {
      __assert_fail("Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                    ,0x608,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
    }
    local_1c = local_1c + 1;
  }
  __assert_fail("Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 0)) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                ,0x607,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
}

Assistant:

void Cbs2_ManCheckFanouts( Cbs2_Man_t * p )
{
    Gia_Obj_t * pObj;
    int iObj;
    Gia_ManForEachObj( p->pAig, pObj, iObj )
    {
        assert( Vec_IntEntry(&p->vFanout0, iObj) == 0 );
        assert( Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 0)) == 0 );
        assert( Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 1)) == 0 );
    }
}